

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise_x86_fma.cpp
# Opt level: O3

int __thiscall
ncnn::ConvolutionDepthWise_x86_fma::create_pipeline_int8_x86
          (ConvolutionDepthWise_x86_fma *this,Option *opt)

{
  uint uVar1;
  uint _h;
  int *piVar2;
  void *pvVar3;
  Allocator *pAVar4;
  long lVar5;
  ulong uVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  Mat local_60;
  
  iVar9 = (this->super_ConvolutionDepthWise).kernel_h * (this->super_ConvolutionDepthWise).kernel_w;
  uVar1 = (this->super_ConvolutionDepthWise).num_output;
  _h = (this->super_ConvolutionDepthWise).group;
  uVar6 = (long)(this->super_ConvolutionDepthWise).weight_data_size / (long)(int)_h;
  uVar6 = (long)((ulong)(uint)((int)uVar6 >> 0x1f) << 0x20 | uVar6 & 0xffffffff) / (long)iVar9;
  lVar5 = (long)((int)uVar1 / (int)_h);
  uVar6 = (ulong)(uint)((int)uVar6 >> 0x1f) << 0x20 | uVar6 & 0xffffffff;
  if ((_h == uVar1) && ((int)((long)uVar6 / lVar5) * _h == _h)) {
    if (((_h & 7) == 0) && (opt->use_packing_layout != false)) {
      Mat::reshape(&local_60,&(this->super_ConvolutionDepthWise).weight_data,iVar9,_h,
                   (Allocator *)0x0);
      convert_packing(&local_60,&this->weight_data_tm,8,opt);
      if (local_60.refcount != (int *)0x0) {
        LOCK();
        *local_60.refcount = *local_60.refcount + -1;
        UNLOCK();
        if (*local_60.refcount == 0) {
          if (local_60.allocator == (Allocator *)0x0) {
            if (local_60.data != (void *)0x0) {
              free(local_60.data);
            }
          }
          else {
            (*(local_60.allocator)->_vptr_Allocator[3])();
          }
        }
      }
    }
    else {
      piVar2 = (this->super_ConvolutionDepthWise).weight_data.refcount;
      if (piVar2 != (int *)0x0) {
        LOCK();
        *piVar2 = *piVar2 + 1;
        UNLOCK();
      }
      piVar2 = (this->weight_data_tm).refcount;
      if (piVar2 != (int *)0x0) {
        LOCK();
        *piVar2 = *piVar2 + -1;
        UNLOCK();
        if (*piVar2 == 0) {
          pvVar3 = (this->weight_data_tm).data;
          pAVar4 = (this->weight_data_tm).allocator;
          if (pAVar4 == (Allocator *)0x0) {
            if (pvVar3 != (void *)0x0) {
              free(pvVar3);
            }
          }
          else {
            (*pAVar4->_vptr_Allocator[3])(pAVar4,pvVar3,(long)uVar6 % lVar5 & 0xffffffff);
          }
        }
      }
      piVar2 = (this->super_ConvolutionDepthWise).weight_data.refcount;
      (this->weight_data_tm).data = (this->super_ConvolutionDepthWise).weight_data.data;
      (this->weight_data_tm).refcount = piVar2;
      (this->weight_data_tm).elemsize = (this->super_ConvolutionDepthWise).weight_data.elemsize;
      (this->weight_data_tm).elempack = (this->super_ConvolutionDepthWise).weight_data.elempack;
      (this->weight_data_tm).allocator = (this->super_ConvolutionDepthWise).weight_data.allocator;
      iVar9 = (this->super_ConvolutionDepthWise).weight_data.w;
      iVar7 = (this->super_ConvolutionDepthWise).weight_data.h;
      iVar8 = (this->super_ConvolutionDepthWise).weight_data.d;
      (this->weight_data_tm).dims = (this->super_ConvolutionDepthWise).weight_data.dims;
      (this->weight_data_tm).w = iVar9;
      (this->weight_data_tm).h = iVar7;
      (this->weight_data_tm).d = iVar8;
      (this->weight_data_tm).c = (this->super_ConvolutionDepthWise).weight_data.c;
      (this->weight_data_tm).cstep = (this->super_ConvolutionDepthWise).weight_data.cstep;
    }
  }
  else {
    create_group_ops(this,opt);
  }
  if (opt->lightmode == true) {
    piVar2 = (this->super_ConvolutionDepthWise).weight_data.refcount;
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        pvVar3 = (this->super_ConvolutionDepthWise).weight_data.data;
        pAVar4 = (this->super_ConvolutionDepthWise).weight_data.allocator;
        if (pAVar4 == (Allocator *)0x0) {
          if (pvVar3 != (void *)0x0) {
            free(pvVar3);
          }
        }
        else {
          (*pAVar4->_vptr_Allocator[3])();
        }
      }
    }
    (this->super_ConvolutionDepthWise).weight_data.cstep = 0;
    *(undefined8 *)((long)&(this->super_ConvolutionDepthWise).weight_data.refcount + 4) = 0;
    *(undefined8 *)((long)&(this->super_ConvolutionDepthWise).weight_data.elemsize + 4) = 0;
    (this->super_ConvolutionDepthWise).weight_data.data = (void *)0x0;
    (this->super_ConvolutionDepthWise).weight_data.refcount = (int *)0x0;
    (this->super_ConvolutionDepthWise).weight_data.dims = 0;
    (this->super_ConvolutionDepthWise).weight_data.w = 0;
    (this->super_ConvolutionDepthWise).weight_data.h = 0;
    (this->super_ConvolutionDepthWise).weight_data.d = 0;
    (this->super_ConvolutionDepthWise).weight_data.c = 0;
  }
  return 0;
}

Assistant:

int ConvolutionDepthWise_x86_fma::create_pipeline_int8_x86(const Option& opt)
{
    const int maxk = kernel_w * kernel_h;
    int channels = (weight_data_size / group) / maxk / (num_output / group) * group;

    // depth-wise
    if (channels == group && group == num_output)
    {
        int elempack = 1;
#if __SSE2__
        if (opt.use_packing_layout)
        {
            elempack = channels % 8 == 0 ? 8 : 1;
        }
#endif // __SSE2__

        if (elempack == 8)
        {
            Mat weight_data_r2 = weight_data.reshape(maxk, group);
            convert_packing(weight_data_r2, weight_data_tm, 8, opt);
        }

        if (elempack == 1)
        {
            weight_data_tm = weight_data;
        }

        if (opt.lightmode)
            weight_data.release();

        return 0;
    }

    // group convolution
    create_group_ops(opt);

    if (opt.lightmode)
        weight_data.release();

    return 0;
}